

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O3

int pkcs7_verify_unwrap(scep *s,char *cachainfile)

{
  uint uVar1;
  int iVar2;
  uint len;
  BIO_METHOD *pBVar3;
  BIO *pBVar4;
  PKCS7 *pPVar5;
  BIO *b;
  stack_st_PKCS7_SIGNER_INFO *psVar6;
  PKCS7_SIGNER_INFO *si;
  X509 *x509;
  X509_STORE *ctx;
  X509_STORE_CTX *ctx_00;
  char *fmt;
  int level;
  uchar buffer [1024];
  undefined1 auStack_438 [1032];
  
  pBVar3 = BIO_s_mem();
  pBVar4 = BIO_new(pBVar3);
  log_log(1,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,0x141,"reading outer PKCS#7");
  uVar1 = BIO_write(pBVar4,s->reply_payload,s->reply_len);
  if ((int)uVar1 < 1) {
    fmt = "error reading PKCS#7 data";
    level = 4;
    iVar2 = 0x143;
  }
  else {
    log_log(1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0x147,"PKCS#7 payload size: %d bytes",(ulong)uVar1);
    BIO_set_flags(pBVar4,0x200);
    pPVar5 = (PKCS7 *)d2i_PKCS7_bio(pBVar4,(PKCS7 **)0x0);
    s->reply_p7 = pPVar5;
    if (d_flag != 0) {
      log_log(0,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
              ,0x14b,"printing PEM fomatted PKCS#7");
      PEM_write_PKCS7(_stdout,(PKCS7 *)s->reply_p7);
      pPVar5 = s->reply_p7;
    }
    iVar2 = OBJ_obj2nid((ASN1_OBJECT *)pPVar5->type);
    if (iVar2 == 0x16) {
      pBVar4 = PKCS7_dataInit((PKCS7 *)s->reply_p7,(BIO *)0x0);
      if (pBVar4 == (BIO *)0x0) {
        fmt = "cannot get PKCS#7 data";
        level = 4;
        iVar2 = 0x159;
      }
      else {
        pBVar3 = BIO_s_mem();
        b = BIO_new(pBVar3);
        uVar1 = BIO_read(pBVar4,auStack_438,0x400);
        len = uVar1;
        while (0 < (int)len) {
          BIO_write(b,auStack_438,len);
          len = BIO_read(pBVar4,auStack_438,0x400);
          uVar1 = uVar1 + len;
        }
        BIO_ctrl(b,0xb,0,(void *)0x0);
        log_log(1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                ,0x168,"PKCS#7 contains %d bytes of signed data",(ulong)uVar1);
        psVar6 = PKCS7_get_signer_info((PKCS7 *)s->reply_p7);
        if (psVar6 == (stack_st_PKCS7_SIGNER_INFO *)0x0) {
          log_log(4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                  ,0x16d,"cannot get signer info!\n",pname);
          goto LAB_0010b0ef;
        }
        log_log(1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                ,0x173,"verifying signature");
        si = (PKCS7_SIGNER_INFO *)OPENSSL_sk_value(psVar6,0);
        x509 = PKCS7_cert_from_signer_info((PKCS7 *)s->reply_p7,si);
        if (x509 == (X509 *)0x0) {
          log_log(2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                  ,0x177,"Can\'t read signer cert from pkcs7");
        }
        iVar2 = PKCS7_signatureVerify(pBVar4,(PKCS7 *)s->reply_p7,si,x509);
        if (0 < iVar2) {
          log_log(1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                  ,0x17f,"signature ok\n");
          ctx = X509_STORE_new();
          if (ctx == (X509_STORE *)0x0) {
            log_log(4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                    ,0x184,"error verifying certificates");
          }
          X509_STORE_set_flags(ctx,0);
          X509_STORE_load_locations(ctx,cachainfile,(char *)0x0);
          ctx_00 = X509_STORE_CTX_new();
          if (ctx_00 == (X509_STORE_CTX *)0x0) {
            log_log(4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                    ,0x18c,"error creating certificate chain");
          }
          iVar2 = X509_STORE_CTX_init(ctx_00,ctx,x509,(stack_st_X509 *)0x0);
          if (iVar2 == 0) {
            log_log(4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                    ,0x191,"error verifying certificates");
          }
          iVar2 = X509_verify_cert(ctx_00);
          if (iVar2 == 0) {
            log_log(4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                    ,0x197,"The signer certificate verification failed");
          }
          if (w_flag != 0) {
            write_cert((X509 *)x509,w_char);
          }
          pPVar5 = (PKCS7 *)d2i_PKCS7_bio(b,(PKCS7 **)0x0);
          s->reply_p7 = pPVar5;
          X509_STORE_free(ctx);
          X509_STORE_CTX_cleanup(ctx_00);
          return 0;
        }
        fmt = "error verifying signature Error";
        level = 2;
        iVar2 = 0x17b;
      }
    }
    else {
      fmt = "PKCS#7 is not signed!";
      level = 4;
      iVar2 = 0x151;
    }
  }
  log_log(level,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c",
          iVar2,fmt);
LAB_0010b0ef:
  ERR_print_errors_fp(_stderr);
  exit(0x61);
}

Assistant:

int pkcs7_verify_unwrap(struct scep *s , char * cachainfile ) {
    BIO                *memorybio;
    BIO                *outbio;
    BIO                *pkcs7bio;
    int                i, len, bytes, used;
    STACK_OF(PKCS7_SIGNER_INFO)    *sk;
    PKCS7                *p7;
    PKCS7_SIGNER_INFO        *si;
    X509_ATTRIBUTE_STACK        *attribs;
    char                *p;
    unsigned char            buffer[1024];
    X509                *recipientcert;
    EVP_PKEY            *recipientkey;
    X509                   *signercert;
    FILE                 *fp;

    X509_STORE_CTX         *cert_ctx;

    X509_STORE *cert_store=NULL;


    /* Create new memory BIO for outer PKCS#7 */
    memorybio = BIO_new(BIO_s_mem());

    /* Read in data */
    log_debug("reading outer PKCS#7");
    if ((len = BIO_write(memorybio, s->reply_payload, s->reply_len)) <= 0) {
        log_error("error reading PKCS#7 data");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }
    log_debug("PKCS#7 payload size: %d bytes", len);
    BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
    s->reply_p7 = d2i_PKCS7_bio(memorybio, NULL);
    if (d_flag) {
        log_trace("printing PEM fomatted PKCS#7");
        PEM_write_PKCS7(stdout, s->reply_p7);
    }

     // Make sure this is a signed PKCS#7
    if (!PKCS7_type_is_signed(s->reply_p7)) {
        log_error("PKCS#7 is not signed!");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }

    // Create BIO for content data
    pkcs7bio = PKCS7_dataInit(s->reply_p7, NULL);
    if (pkcs7bio == NULL) {
        log_error("cannot get PKCS#7 data");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }

    // Copy enveloped data from PKCS#7
    outbio = BIO_new(BIO_s_mem());
    used = 0;
    for (;;) {
        bytes = BIO_read(pkcs7bio, buffer, sizeof(buffer));
        used += bytes;
        if (bytes <= 0) break;
        BIO_write(outbio, buffer, bytes);
    }
    BIO_flush(outbio);
    log_debug("PKCS#7 contains %d bytes of signed data", used);

    // Get signer
    sk = PKCS7_get_signer_info(s->reply_p7);
    if (sk == NULL) {
        log_error("cannot get signer info!\n", pname);
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }

    // Verify signature
    log_debug("verifying signature");
    si = sk_PKCS7_SIGNER_INFO_value(sk, 0);

    signercert = PKCS7_cert_from_signer_info(s->reply_p7, si);
    if(signercert == NULL ) log_info("Can't read signer cert from pkcs7");

    if (PKCS7_signatureVerify(pkcs7bio, s->reply_p7, si,signercert ) <= 0) {
        // reson = ERR_GET_REASON(ERR_peek_last_error());
        log_info("error verifying signature Error");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }
    log_debug("signature ok\n");

    // verify certificates
    cert_store=X509_STORE_new();
    if(cert_store == NULL)
        log_error("error verifying certificates");

    X509_STORE_set_flags(cert_store, 0);

    //X509_STORE_load_locations(cert_store,certsfile,certsdir);
    X509_STORE_load_locations(cert_store,cachainfile,NULL);

    if(!(cert_ctx = X509_STORE_CTX_new())) {;
        log_error("error creating certificate chain");
    }

    if(!X509_STORE_CTX_init(cert_ctx,cert_store,signercert,NULL))
    {
        log_error("error verifying certificates");
    }

    //X509_STORE_CTX_set_purpose(cert_ctx, purpose);

    if( !X509_verify_cert(cert_ctx)) {
        log_error("The signer certificate verification failed");
    }

    /*Write pem encoded signer certificate */
    if(w_flag) {
        write_cert(signercert, w_char);
    }
    /* Copy enveloped data into PKCS#7 */
    s->reply_p7 = d2i_PKCS7_bio(outbio, NULL);

    X509_STORE_free(cert_store);
    X509_STORE_CTX_cleanup(cert_ctx);

    return (0);
}